

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O2

Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* anon_unknown.dwarf_721ea::Shader::create
            (Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,GLuint kind,string *src)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  char *pcVar3;
  GLuint GVar4;
  int iVar5;
  size_type sVar6;
  size_t sVar7;
  uint uVar8;
  size_type sVar9;
  int line;
  string_view sv;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8a8;
  Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_898;
  string local_890;
  int pos;
  int mod;
  GLsizei length;
  GLint compiled;
  string error_string;
  GLchar *c_src;
  char info [2048];
  
  GVar4 = glCreateShader(kind);
  c_src = (src->_M_dataplus)._M_p;
  uVar8 = 1;
  glShaderSource(GVar4,1,&c_src,0);
  glCompileShader(GVar4);
  compiled = 0;
  glGetShaderiv(GVar4,0x8b81,&compiled);
  if (compiled == 1) {
    (__return_storage_ptr__->field_0).value_.name_ = GVar4;
    info[0] = '\0';
    info[1] = '\0';
    info[2] = '\0';
    info[3] = '\0';
    __return_storage_ptr__->has_value_ = true;
    ~Shader((Shader *)info);
  }
  else {
    length = 0;
    glGetShaderInfoLog(GVar4,0x800,&length,info);
    glDeleteShader(GVar4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&error_string,info,(allocator<char> *)&local_890);
    iVar5 = __isoc99_sscanf(info,"%d:%d(%d)",&mod,&line,&pos);
    if (iVar5 == 3) {
      sv._M_str = (src->_M_dataplus)._M_p;
      sv._M_len = src->_M_string_length;
      local_898 = __return_storage_ptr__;
      for (; (__return_storage_ptr__ = local_898, sv._M_len != 0 && ((int)uVar8 < line + 3));
          uVar8 = uVar8 + 1) {
        sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::find(&sv,"\n",0);
        sVar2 = sv._M_len;
        sVar9 = sVar6;
        if (sVar6 == 0xffffffffffffffff) {
          sVar9 = sv._M_len;
        }
        if (line + -3 <= (int)uVar8) {
          format_abi_cxx11_(&local_890,"\n%d: ",(ulong)uVar8);
          std::__cxx11::string::append((string *)&error_string);
          std::__cxx11::string::~string((string *)&local_890);
          std::__cxx11::string::append<char_const*,void>
                    ((string *)&error_string,sv._M_str,sv._M_str + sVar9);
        }
        sVar7 = sVar6 + 1;
        if (sVar6 + 1 == 0) {
          sVar7 = sVar2;
        }
        sv._M_str = sv._M_str + sVar7;
        sv._M_len = sv._M_len - sVar7;
      }
    }
    format_abi_cxx11_((string *)&sv,"Shader compilation error: %s",error_string._M_dataplus._M_p);
    pcVar3 = sv._M_str;
    local_890._M_dataplus._M_p = (pointer)&local_890.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sv._M_len == &local_8a8) {
      local_890.field_2._8_8_ = local_8a8._8_8_;
      sv._M_len = (size_t)local_890._M_dataplus._M_p;
    }
    local_890.field_2._M_allocated_capacity._1_7_ = local_8a8._M_allocated_capacity._1_7_;
    local_890.field_2._M_local_buf[0] = local_8a8._M_local_buf[0];
    sv._M_str = (char *)0x0;
    local_8a8._M_local_buf[0] = '\0';
    paVar1 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&__return_storage_ptr__->field_0 = paVar1;
    if ((pointer)sv._M_len == local_890._M_dataplus._M_p) {
      paVar1->_M_allocated_capacity = local_890.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
           local_890.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p = (pointer)sv._M_len;
      (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
           local_890.field_2._M_allocated_capacity;
    }
    local_890._M_string_length = 0;
    (__return_storage_ptr__->field_0).error_.error_._M_string_length = (size_type)pcVar3;
    local_890.field_2._M_allocated_capacity =
         (ulong)(uint7)local_8a8._M_allocated_capacity._1_7_ << 8;
    __return_storage_ptr__->has_value_ = false;
    sv._M_len = (size_t)&local_8a8;
    std::__cxx11::string::~string((string *)&local_890);
    std::__cxx11::string::~string((string *)&sv);
    std::__cxx11::string::~string((string *)&error_string);
  }
  return __return_storage_ptr__;
}

Assistant:

static Expected<Shader,std::string> create(GLuint kind, const std::string& src) {
		GLuint name = glCreateShader(kind);
		GLchar const * const c_src = src.c_str();
		glShaderSource(name, 1, (const GLchar**)&c_src, nullptr);
		glCompileShader(name);

		GLint compiled = GL_FALSE;
		glGetShaderiv(name, GL_COMPILE_STATUS, &compiled);
		if (compiled != GL_TRUE) {
			GLsizei length = 0;
			char info[2048];
			glGetShaderInfoLog(name, COUNTOF(info), &length, info);
			glDeleteShader(name);

			std::string error_string = info;

			const int context = 3;
			int mod, line, pos;
			if (3 == sscanf(info, "%d:%d(%d)", &mod, &line, &pos)) {
				std::string_view sv(src);
				for (int i = 1; !sv.empty() && i < line + context; ++i) {
					size_t line_end = sv.find("\n");
					int add = 0;

					if (line_end == std::string::npos)
						line_end = sv.size();
					else add = 1;

					if (i >= line - context) {
						error_string += format("\n%d: ", i);
						error_string.append(sv.begin(), sv.begin() + line_end);
					}

					sv.remove_prefix(line_end + add);
				}
			} else {
				//error_string = src;
			}

			return Unexpected(format("Shader compilation error: %s", error_string.c_str()));
		}

		return Shader(name);
	}